

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall
prometheus::Histogram::ObserveMultiple
          (Histogram *this,vector<double,_std::allocator<double>_> *bucket_increments,
          double sum_of_values)

{
  size_type sVar1;
  size_type sVar2;
  length_error *this_00;
  reference this_01;
  const_reference pvVar3;
  ulong local_40;
  size_t i;
  lock_guard<std::mutex> lock;
  double sum_of_values_local;
  vector<double,_std::allocator<double>_> *bucket_increments_local;
  Histogram *this_local;
  
  sVar1 = ::std::vector<double,_std::allocator<double>_>::size(bucket_increments);
  sVar2 = ::std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::size
                    (&this->bucket_counts_);
  if (sVar1 != sVar2) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    ::std::length_error::length_error
              (this_00,
               "The size of bucket_increments was not equal tothe number of buckets in the histogram."
              );
    __cxa_throw(this_00,&::std::length_error::typeinfo,::std::length_error::~length_error);
  }
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&i,&this->mutex_);
  Gauge::Increment(&this->sum_,sum_of_values);
  local_40 = 0;
  while( true ) {
    sVar1 = ::std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::size
                      (&this->bucket_counts_);
    if (sVar1 <= local_40) break;
    this_01 = ::std::vector<prometheus::Counter,_std::allocator<prometheus::Counter>_>::operator[]
                        (&this->bucket_counts_,local_40);
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[](bucket_increments,local_40);
    Counter::Increment(this_01,*pvVar3);
    local_40 = local_40 + 1;
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&i);
  return;
}

Assistant:

void Histogram::ObserveMultiple(const std::vector<double>& bucket_increments,
                                const double sum_of_values) {
  if (bucket_increments.size() != bucket_counts_.size()) {
    throw std::length_error(
        "The size of bucket_increments was not equal to"
        "the number of buckets in the histogram.");
  }

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(sum_of_values);

  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Increment(bucket_increments[i]);
  }
}